

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreateComputePipelines
                   (VkDevice device,VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkComputePipelineCreateInfo *pCreateInfos,VkAllocationCallbacks *pAllocator,
                   VkPipeline *pPipelines)

{
  int *piVar1;
  byte *pbVar2;
  Instance *pIVar3;
  undefined4 uVar4;
  bool bVar5;
  VkResult VVar6;
  VkResult VVar7;
  LogLevel LVar8;
  VkBaseInStructure *s_1;
  Device *this;
  ulong uVar9;
  VkComputePipelineCreateInfo *pVVar10;
  int *piVar11;
  ulong uVar12;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var13;
  uint uVar14;
  long lVar15;
  VkPipeline *ppVVar16;
  uint32_t i;
  long lVar17;
  int *piVar18;
  VkPipeline pipeline;
  VkComputePipelineCreateInfo *pVVar19;
  ulong uVar20;
  uint32_t i_1;
  byte bVar21;
  VkComputePipelineCreateInfo local_90;
  
  bVar21 = 0;
  this = get_device_layer(*(VkDevice *)device);
  pIVar3 = this->pInstance;
  if ((pIVar3->enableCrashHandler == false) && ((pIVar3->synchronized & 1U) == 0)) {
    bVar5 = false;
    if ((createInfoCount != 0) && (pIVar3->enablePrecompileQA != false)) {
      uVar20 = (ulong)createInfoCount;
      uVar9 = 0;
      bVar5 = false;
      do {
        uVar14 = pCreateInfos[uVar9].flags;
        piVar11 = (int *)pCreateInfos[uVar9].pNext;
        for (piVar18 = piVar11; piVar18 != (int *)0x0; piVar18 = *(int **)(piVar18 + 2)) {
          if (*piVar18 == 0x3ba1f5f5) {
            uVar14 = (uint)*(undefined8 *)(piVar18 + 4);
            break;
          }
        }
        piVar18 = piVar11;
        if (piVar11 == (int *)0x0) {
LAB_001165af:
          if ((uVar14 >> 8 & 1) != 0) {
LAB_001169e7:
            bVar5 = false;
            goto LAB_00116a59;
          }
        }
        else {
          do {
            if (*piVar18 == 0x3b9f36d0) goto LAB_00116568;
            piVar1 = piVar18 + 2;
            piVar18 = *(int **)piVar1;
          } while (*(int **)piVar1 != (int *)0x0);
          piVar18 = (int *)0x0;
LAB_00116568:
          do {
            if (*piVar11 == 0x3ba228ba) {
              if (piVar11[4] != 0) goto LAB_001169e7;
              break;
            }
            piVar11 = *(int **)(piVar11 + 2);
          } while (piVar11 != (int *)0x0);
          if (piVar18 == (int *)0x0) goto LAB_001165af;
          if (((uVar14 >> 10 & 1) == 0 && piVar18[4] != 0) || ((uVar14 & 0x100) != 0))
          goto LAB_00116a59;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar20);
      ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_90);
      pVVar10 = (VkComputePipelineCreateInfo *)
                ScratchAllocator::allocate_raw((ScratchAllocator *)&local_90,uVar20 * 0x60,0x10);
      memcpy(pVVar10,pCreateInfos,uVar20 * 0x60);
      uVar9 = 0;
      do {
        pbVar2 = (byte *)((long)&pVVar10[uVar9].flags + 1);
        *pbVar2 = *pbVar2 | 1;
        bVar5 = shallowCopyPnextChain
                          ((ScratchAllocator *)&local_90,pVVar10[uVar9].pNext,&pVVar10[uVar9].pNext)
        ;
        if (!bVar5) goto LAB_00116a42;
        for (piVar11 = (int *)pVVar10[uVar9].pNext; piVar11 != (int *)0x0;
            piVar11 = *(int **)(piVar11 + 2)) {
          if (*piVar11 == 0x3ba1f5f5) {
            *(byte *)((long)piVar11 + 0x11) = *(byte *)((long)piVar11 + 0x11) | 1;
            break;
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar20);
      VVar7 = (*this->pTable->CreateComputePipelines)
                        (device,(VkPipelineCache)0x0,createInfoCount,pVVar10,pAllocator,pPipelines);
      if (VVar7 != VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        Device::registerPrecompileQASuccess(this,createInfoCount);
        ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_90);
        return VVar7;
      }
      uVar9 = 0;
      do {
        if (pPipelines[uVar9] == (VkPipeline)0x0) {
          for (piVar11 = (int *)pCreateInfos[uVar9].pNext; piVar11 != (int *)0x0;
              piVar11 = *(int **)(piVar11 + 2)) {
            if (*piVar11 == 0x3ba1f5f5) {
              uVar12 = *(ulong *)(piVar11 + 4);
              goto LAB_001166e1;
            }
          }
          uVar12 = (ulong)pCreateInfos[uVar9].flags;
LAB_001166e1:
          LVar8 = get_thread_log_level();
          if ((int)LVar8 < 2) {
            bVar5 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                               ,uVar12 >> 0x20);
            if (!bVar5) {
              fprintf(_stderr,
                      "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                      ,uVar12 >> 0x20,uVar12);
            }
          }
          Device::registerPrecompileQAFailure(this,1);
          if (this->usesModuleIdentifiers == true) {
            p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
          }
          else {
            p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
          }
          bVar5 = StateRecorder::record_compute_pipeline
                            (this->recorder,pPipelines[uVar9],pCreateInfos + uVar9,pPipelines,
                             createInfoCount,0,device,p_Var13);
          if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
             (bVar5 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                ), !bVar5)) {
            CreateComputePipelines();
          }
        }
        else {
          Device::registerPrecompileQASuccess(this,1);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar20);
      uVar9 = 0;
      do {
        (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar9],pAllocator);
        pPipelines[uVar9] = (VkPipeline)0x0;
        uVar9 = uVar9 + 1;
      } while (uVar20 != uVar9);
LAB_00116a42:
      ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_90);
      bVar5 = true;
    }
LAB_00116a59:
    VVar7 = (*this->pTable->CreateComputePipelines)
                      (device,pipelineCache,createInfoCount,pCreateInfos,pAllocator,pPipelines);
    if (bVar5) {
      return VVar7;
    }
    if (VVar7 != VK_SUCCESS) {
      return VVar7;
    }
    if (createInfoCount != 0) {
      uVar20 = 0;
      do {
        if (this->usesModuleIdentifiers == true) {
          p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar5 = StateRecorder::record_compute_pipeline
                          (this->recorder,pPipelines[uVar20],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var13);
        if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
           (bVar5 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar5)) {
          CreateComputePipelines();
        }
        uVar20 = uVar20 + 1;
        pCreateInfos = pCreateInfos + 1;
      } while (createInfoCount != uVar20);
    }
  }
  else if (createInfoCount != 0) {
    memset(pPipelines,0,(ulong)createInfoCount * 8);
    lVar17 = 0;
    VVar7 = VK_SUCCESS;
    ppVVar16 = pPipelines;
    while( true ) {
      pVVar10 = pCreateInfos;
      pVVar19 = &local_90;
      for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
        uVar4 = *(undefined4 *)&pVVar10->field_0x4;
        pVVar19->sType = pVVar10->sType;
        *(undefined4 *)&pVVar19->field_0x4 = uVar4;
        pVVar10 = (VkComputePipelineCreateInfo *)((long)pVVar10 + (ulong)bVar21 * -0x10 + 8);
        pVVar19 = (VkComputePipelineCreateInfo *)((long)pVVar19 + ((ulong)bVar21 * -2 + 1) * 8);
      }
      if ((-1 < local_90.basePipelineIndex &
          local_90.basePipelineHandle == (VkPipeline)0x0 & (byte)local_90.flags >> 2) == 1) {
        local_90.basePipelineHandle = pPipelines[(uint)local_90.basePipelineIndex];
        local_90.basePipelineIndex = 0xffffffff;
      }
      if (this->pInstance->synchronized == true) {
        if (this->usesModuleIdentifiers == true) {
          p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar5 = StateRecorder::record_compute_pipeline
                          (this->recorder,(VkPipeline)0x0,&local_90,(VkPipeline *)0x0,0,0,device,
                           p_Var13);
        if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
           (bVar5 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
           !bVar5)) {
          CreateComputePipelines();
        }
      }
      Instance::braceForComputePipelineCrash(this->recorder,&local_90);
      VVar6 = (*this->pTable->CreateComputePipelines)
                        (device,pipelineCache,1,&local_90,pAllocator,ppVVar16);
      Instance::completedPipelineCompilation();
      if (VVar6 == VK_SUCCESS) {
        pipeline = *ppVVar16;
      }
      else {
        pipeline = (VkPipeline)0x0;
      }
      if (this->usesModuleIdentifiers == true) {
        p_Var13 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
      }
      else {
        p_Var13 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
      }
      bVar5 = StateRecorder::record_compute_pipeline
                        (this->recorder,pipeline,&local_90,(VkPipeline *)0x0,0,0,device,p_Var13);
      if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
         (bVar5 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                            ), !bVar5)) {
        CreateComputePipelines();
      }
      if (VVar6 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        VVar7 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      if (VVar6 < VK_SUCCESS) break;
      if ((VVar6 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) && ((local_90.flags._1_1_ & 2) != 0)) {
        return VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
      }
      lVar17 = lVar17 + -1;
      ppVVar16 = ppVVar16 + 1;
      pCreateInfos = pCreateInfos + 1;
      if (-(ulong)createInfoCount == lVar17) {
        return VVar7;
      }
    }
    if (lVar17 == 0) {
      return VVar6;
    }
    lVar15 = 0;
    do {
      (*this->pTable->DestroyPipeline)(device,pPipelines[lVar15],pAllocator);
      lVar15 = lVar15 + 1;
    } while (-lVar17 != lVar15);
    return VVar6;
  }
  return VK_SUCCESS;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateComputePipelines(VkDevice device, VkPipelineCache pipelineCache,
                                                             uint32_t createInfoCount,
                                                             const VkComputePipelineCreateInfo *pCreateInfos,
                                                             const VkAllocationCallbacks *pAllocator,
                                                             VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
		return CreateComputePipelinesParanoid(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
	else
		return CreateComputePipelinesNormal(layer, device, pipelineCache, createInfoCount, pCreateInfos, pAllocator, pPipelines);
}